

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::EpsCopyInputStream::PopLimit(EpsCopyInputStream *this,LimitToken *delta)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  int local_24;
  LimitToken *local_20;
  LimitToken *delta_local;
  EpsCopyInputStream *this_local;
  
  iVar1 = this->limit_;
  local_20 = delta;
  delta_local = (LimitToken *)this;
  iVar4 = LimitToken::token(delta);
  this->limit_ = iVar1 + iVar4;
  bVar3 = EndedAtLimit(this);
  bVar3 = ((bVar3 ^ 0xffU) & 1) == 0;
  if (bVar3) {
    pcVar2 = this->buffer_end_;
    local_24 = 0;
    piVar5 = std::min<int>(&local_24,&this->limit_);
    this->limit_end_ = pcVar2 + *piVar5;
  }
  return bVar3;
}

Assistant:

[[nodiscard]] bool PopLimit(LimitToken delta) {
    // We must update the limit first before the early return. Otherwise, we can
    // end up with an invalid limit and it can lead to integer overflows.
    limit_ = limit_ + std::move(delta).token();
    if (ABSL_PREDICT_FALSE(!EndedAtLimit())) return false;
    // TODO We could remove this line and hoist the code to
    // DoneFallback. Study the perf/bin-size effects.
    limit_end_ = buffer_end_ + (std::min)(0, limit_);
    return true;
  }